

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O2

float find_max_RGBE(uchar *image,int width,int height)

{
  long lVar1;
  int iVar2;
  double dVar3;
  float fVar4;
  float fVar5;
  
  fVar5 = 0.0;
  for (iVar2 = width * height; 0 < iVar2; iVar2 = iVar2 + -1) {
    dVar3 = ldexp(0.003921568859368563,image[3] - 0x80);
    for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
      fVar4 = (float)image[lVar1] * (float)dVar3;
      if ((float)image[lVar1] * (float)dVar3 <= fVar5) {
        fVar4 = fVar5;
      }
      fVar5 = fVar4;
    }
    image = image + 4;
  }
  return fVar5;
}

Assistant:

float
find_max_RGBE
(
	unsigned char *image,
    int width, int height
)
{
	float max_val = 0.0f;
	unsigned char *img = image;
	int i, j;
	for( i = width * height; i > 0; --i )
	{
		/* float scale = powf( 2.0f, img[3] - 128.0f ) / 255.0f; */
		float scale = ldexp( 1.0f / 255.0f, (int)(img[3]) - 128 );
		for( j = 0; j < 3; ++j )
		{
			if( img[j] * scale > max_val )
			{
				max_val = img[j] * scale;
			}
		}
		/* next pixel */
		img += 4;
	}
	return max_val;
}